

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * sqlite3HashInsert(Hash *pH,char *pKey,void *data)

{
  uint *puVar1;
  _ht *p_Var2;
  void *pvVar3;
  HashElem *pHVar4;
  HashElem *pHVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  HashElem *pHVar9;
  _ht *p_Var10;
  byte *pbVar11;
  uint uVar12;
  byte bVar13;
  HashElem *pHVar14;
  long in_FS_OFFSET;
  uint h;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0xaaaaaaaa;
  pHVar9 = findElementWithHash(pH,pKey,&local_3c);
  pvVar3 = pHVar9->data;
  if (pvVar3 == (void *)0x0) {
    if (data != (void *)0x0) {
      pHVar9 = (HashElem *)sqlite3Malloc(0x20);
      if (pHVar9 == (HashElem *)0x0) goto LAB_0015b0a9;
      pHVar9->pKey = pKey;
      pHVar9->data = data;
      uVar6 = pH->count + 1;
      pH->count = uVar6;
      if ((9 < uVar6) && (pH->htsize * 2 < uVar6)) {
        uVar12 = 0x40;
        if (uVar6 * 2 < 0x40) {
          uVar12 = uVar6 * 2;
        }
        if (uVar12 != pH->htsize) {
          if (sqlite3Hooks_0 != (code *)0x0) {
            (*sqlite3Hooks_0)();
          }
          p_Var10 = (_ht *)sqlite3Malloc((ulong)(uVar12 << 4));
          if (sqlite3Hooks_1 != (code *)0x0) {
            (*sqlite3Hooks_1)();
          }
          if (p_Var10 != (_ht *)0x0) {
            sqlite3_free(pH->ht);
            pH->ht = p_Var10;
            iVar7 = (*sqlite3Config.m.xSize)(p_Var10);
            uVar6 = iVar7 >> 4;
            pH->htsize = uVar6;
            uVar12 = 0;
            memset(p_Var10,0,(ulong)uVar6 << 4);
            pHVar4 = pH->first;
            pH->first = (HashElem *)0x0;
            while (pHVar4 != (HashElem *)0x0) {
              pbVar11 = (byte *)pHVar4->pKey;
              bVar13 = *pbVar11;
              uVar8 = 0;
              if (bVar13 != 0) {
                uVar8 = 0;
                do {
                  pbVar11 = pbVar11 + 1;
                  uVar8 = (""[bVar13] + uVar8) * -0x61c8864f;
                  bVar13 = *pbVar11;
                } while (bVar13 != 0);
              }
              pHVar5 = pHVar4->next;
              insertElement(pH,p_Var10 + (ulong)uVar8 % (ulong)uVar6,pHVar4);
              pHVar4 = pHVar5;
            }
            bVar13 = *pKey;
            if (bVar13 != 0) {
              pbVar11 = (byte *)(pKey + 1);
              uVar12 = 0;
              do {
                uVar12 = (""[bVar13] + uVar12) * -0x61c8864f;
                bVar13 = *pbVar11;
                pbVar11 = pbVar11 + 1;
              } while (bVar13 != 0);
            }
            local_3c = uVar12 % pH->htsize;
          }
        }
      }
      p_Var10 = pH->ht + local_3c;
      if (pH->ht == (_ht *)0x0) {
        p_Var10 = (_ht *)0x0;
      }
      insertElement(pH,p_Var10,pHVar9);
    }
    data = (void *)0x0;
  }
  else if (data == (void *)0x0) {
    pHVar4 = pHVar9->next;
    pHVar5 = pHVar9->prev;
    pHVar14 = (HashElem *)&pH->first;
    if (pHVar5 != (HashElem *)0x0) {
      pHVar14 = pHVar5;
    }
    pHVar14->next = pHVar4;
    if (pHVar4 != (HashElem *)0x0) {
      pHVar4->prev = pHVar5;
    }
    p_Var10 = pH->ht;
    if (p_Var10 != (_ht *)0x0) {
      p_Var2 = p_Var10 + local_3c;
      if (p_Var10[local_3c].chain == pHVar9) {
        p_Var2->chain = pHVar4;
      }
      p_Var2->count = p_Var2->count - 1;
    }
    sqlite3_free(pHVar9);
    puVar1 = &pH->count;
    *puVar1 = *puVar1 - 1;
    data = pvVar3;
    if (*puVar1 == 0) {
      sqlite3HashClear(pH);
    }
  }
  else {
    pHVar9->data = data;
    pHVar9->pKey = pKey;
    data = pvVar3;
  }
LAB_0015b0a9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return data;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void *sqlite3HashInsert(Hash *pH, const char *pKey, void *data){
  unsigned int h;       /* the hash of the key modulo hash table size */
  HashElem *elem;       /* Used to loop thru the element list */
  HashElem *new_elem;   /* New element added to the pH */

  assert( pH!=0 );
  assert( pKey!=0 );
  elem = findElementWithHash(pH,pKey,&h);
  if( elem->data ){
    void *old_data = elem->data;
    if( data==0 ){
      removeElementGivenHash(pH,elem,h);
    }else{
      elem->data = data;
      elem->pKey = pKey;
    }
    return old_data;
  }
  if( data==0 ) return 0;
  new_elem = (HashElem*)sqlite3Malloc( sizeof(HashElem) );
  if( new_elem==0 ) return data;
  new_elem->pKey = pKey;
  new_elem->data = data;
  pH->count++;
  if( pH->count>=10 && pH->count > 2*pH->htsize ){
    if( rehash(pH, pH->count*2) ){
      assert( pH->htsize>0 );
      h = strHash(pKey) % pH->htsize;
    }
  }
  insertElement(pH, pH->ht ? &pH->ht[h] : 0, new_elem);
  return 0;
}